

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf.c
# Opt level: O0

int read_var_array(coda_netcdf_product *product,int64_t *offset,int64_t num_dim_lengths,
                  int64_t *dim_length,int appendable_dim,coda_mem_record *root)

{
  int iVar1;
  coda_netcdf_array *type;
  double invalid_value;
  coda_netcdf_array *array;
  long lStack_110;
  int32_t offset32;
  long j;
  uint local_100;
  int num_dims;
  int record_var;
  int last_dim_set;
  long last_dim_length;
  char *name;
  int64_t dim_id;
  int64_t vsize;
  int64_t nelems;
  ulong uStack_c8;
  int32_t nc_type;
  int64_t string_length;
  int64_t var_offset;
  long dim [8];
  coda_conversion *local_70;
  coda_conversion *conversion;
  coda_mem_record *attributes;
  coda_netcdf_basic_type *basic_type;
  long i;
  int64_t num_var;
  coda_mem_record *pcStack_40;
  int32_t tag;
  coda_mem_record *root_local;
  int64_t *piStack_30;
  int appendable_dim_local;
  int64_t *dim_length_local;
  int64_t num_dim_lengths_local;
  int64_t *offset_local;
  coda_netcdf_product *product_local;
  
  pcStack_40 = root;
  root_local._4_4_ = appendable_dim;
  piStack_30 = dim_length;
  dim_length_local = (int64_t *)num_dim_lengths;
  num_dim_lengths_local = (int64_t)offset;
  offset_local = (int64_t *)product;
  iVar1 = read_bytes(product->raw_product,*offset,4,(void *)((long)&num_var + 4));
  if (iVar1 < 0) {
    product_local._4_4_ = -1;
  }
  else {
    swap4((void *)((long)&num_var + 4));
    *(long *)num_dim_lengths_local = *(long *)num_dim_lengths_local + 4;
    iVar1 = read_length_value((coda_netcdf_product *)offset_local,(int64_t *)num_dim_lengths_local,
                              &i);
    if (iVar1 == 0) {
      if (num_var._4_4_ == 0) {
        if (i == 0) {
          product_local._4_4_ = 0;
        }
        else {
          coda_set_error(-300,"invalid netCDF file (invalid value for nelems for empty var_array)");
          product_local._4_4_ = -1;
        }
      }
      else if (num_var._4_4_ == 0xb) {
        for (basic_type = (coda_netcdf_basic_type *)0x0; (long)basic_type < i;
            basic_type = (coda_netcdf_basic_type *)((long)&basic_type->backend + 1)) {
          conversion = (coda_conversion *)0x0;
          _record_var = 0;
          num_dims = 0;
          local_100 = 0;
          iVar1 = read_length_value((coda_netcdf_product *)offset_local,
                                    (int64_t *)num_dim_lengths_local,
                                    (int64_t *)&stack0xffffffffffffff38);
          if (iVar1 != 0) {
            return -1;
          }
          last_dim_length = (long)malloc(uStack_c8 + 1);
          if ((void *)last_dim_length == (void *)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",uStack_c8 + 1,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf.c"
                           ,0x230);
            return -1;
          }
          *(undefined1 *)(last_dim_length + uStack_c8) = 0;
          iVar1 = read_bytes((coda_product *)offset_local[9],*(int64_t *)num_dim_lengths_local,
                             uStack_c8,(void *)last_dim_length);
          if (iVar1 < 0) {
            free((void *)last_dim_length);
            return -1;
          }
          *(ulong *)num_dim_lengths_local = uStack_c8 + *(long *)num_dim_lengths_local;
          if ((uStack_c8 & 3) != 0) {
            *(ulong *)num_dim_lengths_local = (4 - (uStack_c8 & 3)) + *(long *)num_dim_lengths_local
            ;
          }
          iVar1 = read_length_value((coda_netcdf_product *)offset_local,
                                    (int64_t *)num_dim_lengths_local,&vsize);
          if (iVar1 != 0) {
            free((void *)last_dim_length);
            return -1;
          }
          j._4_4_ = 0;
          for (lStack_110 = 0; lStack_110 < vsize; lStack_110 = lStack_110 + 1) {
            iVar1 = read_length_value((coda_netcdf_product *)offset_local,
                                      (int64_t *)num_dim_lengths_local,(int64_t *)&name);
            if (iVar1 != 0) {
              free((void *)last_dim_length);
              return -1;
            }
            if (((long)name < 0) || ((long)dim_length_local <= (long)name)) {
              coda_set_error(-300,"invalid netCDF file (invalid dimid for variable %s)",
                             last_dim_length);
              free((void *)last_dim_length);
              return -1;
            }
            if (lStack_110 == vsize + -1) {
              _record_var = piStack_30[(long)name];
              num_dims = 1;
            }
            else if (lStack_110 < 8) {
              dim[lStack_110 + -1] = piStack_30[(long)name];
              j._4_4_ = j._4_4_ + 1;
            }
            else {
              dim[6] = piStack_30[(long)name] * dim[6];
            }
            if (lStack_110 == 0) {
              local_100 = (uint)(name == (char *)(long)root_local._4_4_);
            }
          }
          invalid_value = coda_NaN();
          local_70 = coda_conversion_new(1.0,1.0,0.0,invalid_value);
          if (local_70 == (coda_conversion *)0x0) {
            free((void *)last_dim_length);
            return -1;
          }
          iVar1 = read_att_array((coda_netcdf_product *)offset_local,
                                 (int64_t *)num_dim_lengths_local,(coda_mem_record **)&conversion,
                                 local_70);
          if (iVar1 != 0) {
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          iVar1 = read_bytes((coda_product *)offset_local[9],*(int64_t *)num_dim_lengths_local,4,
                             (void *)((long)&nelems + 4));
          if (iVar1 < 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          swap4((void *)((long)&nelems + 4));
          *(long *)num_dim_lengths_local = *(long *)num_dim_lengths_local + 4;
          if (((int)nelems._4_4_ < 1) || (6 < (int)nelems._4_4_)) {
            coda_set_error(-300,"invalid netCDF file (invalid netcdf type (%d))",(ulong)nelems._4_4_
                          );
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          if (((((local_70->numerator == 1.0) && (!NAN(local_70->numerator))) &&
               (local_70->add_offset == 0.0)) && (!NAN(local_70->add_offset))) &&
             (((nelems._4_4_ != 5 && (nelems._4_4_ != 6)) ||
              (iVar1 = coda_isNaN(local_70->invalid_value), iVar1 != 0)))) {
            coda_conversion_delete(local_70);
            local_70 = (coda_conversion *)0x0;
          }
          iVar1 = read_length_value((coda_netcdf_product *)offset_local,
                                    (int64_t *)num_dim_lengths_local,&dim_id);
          if (iVar1 != 0) {
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          if (local_100 != 0) {
            offset_local[0xb] = dim_id + offset_local[0xb];
          }
          if ((int)offset_local[10] == 1) {
            iVar1 = read_bytes((coda_product *)offset_local[9],*(int64_t *)num_dim_lengths_local,4,
                               (void *)((long)&array + 4));
            if (iVar1 < 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)conversion);
              coda_conversion_delete(local_70);
              free((void *)last_dim_length);
              return -1;
            }
            swap4((void *)((long)&array + 4));
            string_length = (int64_t)array._4_4_;
            *(long *)num_dim_lengths_local = *(long *)num_dim_lengths_local + 4;
          }
          else {
            iVar1 = read_bytes((coda_product *)offset_local[9],*(int64_t *)num_dim_lengths_local,8,
                               &string_length);
            if (iVar1 < 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)conversion);
              coda_conversion_delete(local_70);
              free((void *)last_dim_length);
              return -1;
            }
            swap8(&string_length);
            *(long *)num_dim_lengths_local = *(long *)num_dim_lengths_local + 8;
          }
          if (offset_local[1] < string_length) {
            coda_set_error(-300,"invalid netCDF file (invalid offset for variable %s)",
                           last_dim_length);
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          if (num_dims == 0) {
            attributes = (coda_mem_record *)
                         coda_netcdf_basic_type_new(nelems._4_4_,string_length,0,1);
          }
          else if ((nelems._4_4_ == 2) && ((j._4_4_ != 0 || (local_100 == 0)))) {
            attributes = (coda_mem_record *)
                         coda_netcdf_basic_type_new(2,string_length,local_100,_record_var);
          }
          else {
            attributes = (coda_mem_record *)
                         coda_netcdf_basic_type_new(nelems._4_4_,string_length,local_100,1);
            if (j._4_4_ < 8) {
              dim[(long)j._4_4_ + -1] = _record_var;
              j._4_4_ = j._4_4_ + 1;
            }
            else {
              dim[6] = _record_var * dim[6];
            }
          }
          if (attributes == (coda_mem_record *)0x0) {
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          if ((local_70 != (coda_conversion *)0x0) &&
             (iVar1 = coda_netcdf_basic_type_set_conversion
                                ((coda_netcdf_basic_type *)attributes,local_70), iVar1 != 0)) {
            coda_dynamic_type_delete((coda_dynamic_type *)conversion);
            coda_conversion_delete(local_70);
            free((void *)last_dim_length);
            return -1;
          }
          if (j._4_4_ == 0) {
            if ((conversion != (coda_conversion *)0x0) &&
               (iVar1 = coda_netcdf_basic_type_set_attributes
                                  ((coda_netcdf_basic_type *)attributes,
                                   (coda_mem_record *)conversion), iVar1 != 0)) {
              coda_dynamic_type_delete((coda_dynamic_type *)attributes);
              coda_dynamic_type_delete((coda_dynamic_type *)conversion);
              free((void *)last_dim_length);
              return -1;
            }
            iVar1 = coda_mem_record_add_field
                              (pcStack_40,(char *)last_dim_length,(coda_dynamic_type *)attributes,1)
            ;
            if (iVar1 != 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)attributes);
              free((void *)last_dim_length);
              return -1;
            }
          }
          else {
            type = coda_netcdf_array_new(j._4_4_,&var_offset,(coda_netcdf_basic_type *)attributes);
            if (type == (coda_netcdf_array *)0x0) {
              coda_dynamic_type_delete((coda_dynamic_type *)attributes);
              coda_dynamic_type_delete((coda_dynamic_type *)conversion);
              free((void *)last_dim_length);
              return -1;
            }
            if ((conversion != (coda_conversion *)0x0) &&
               (iVar1 = coda_netcdf_array_set_attributes(type,(coda_mem_record *)conversion),
               iVar1 != 0)) {
              coda_dynamic_type_delete((coda_dynamic_type *)type);
              coda_dynamic_type_delete((coda_dynamic_type *)conversion);
              free((void *)last_dim_length);
              return -1;
            }
            iVar1 = coda_mem_record_add_field
                              (pcStack_40,(char *)last_dim_length,(coda_dynamic_type *)type,1);
            if (iVar1 != 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)type);
              free((void *)last_dim_length);
              return -1;
            }
          }
          free((void *)last_dim_length);
        }
        product_local._4_4_ = 0;
      }
      else {
        coda_set_error(-300,"invalid netCDF file (invalid value for NC_VARIABLE tag)");
        product_local._4_4_ = -1;
      }
    }
    else {
      product_local._4_4_ = -1;
    }
  }
  return product_local._4_4_;
}

Assistant:

static int read_var_array(coda_netcdf_product *product, int64_t *offset, int64_t num_dim_lengths, int64_t *dim_length,
                          int appendable_dim, coda_mem_record *root)
{
    int32_t tag;
    int64_t num_var;
    long i;

    if (read_bytes(product->raw_product, *offset, 4, &tag) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&tag);
#endif
    *offset += 4;

    if (read_length_value(product, offset, &num_var) != 0)
    {
        return -1;
    }

    if (tag == 0)
    {
        if (num_var != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for nelems for empty var_array)");
            return -1;
        }
        return 0;
    }

    if (tag != 11)      /* NC_VARIABLE */
    {
        coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid value for NC_VARIABLE tag)");
        return -1;
    }

    for (i = 0; i < num_var; i++)
    {
        coda_netcdf_basic_type *basic_type;
        coda_mem_record *attributes = NULL;
        coda_conversion *conversion;
        long dim[CODA_MAX_NUM_DIMS];
        int64_t var_offset;
        int64_t string_length;
        int32_t nc_type;
        int64_t nelems;
        int64_t vsize;
        int64_t dim_id;
        char *name;
        long last_dim_length = 0;
        int last_dim_set = 0;
        int record_var = 0;
        int num_dims;
        long j;

        if (read_length_value(product, offset, &string_length) != 0)
        {
            return -1;
        }
        /* chars */
        name = malloc(string_length + 1);
        if (name == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                           (long)(string_length + 1), __FILE__, __LINE__);
            return -1;
        }
        name[string_length] = '\0';
        if (read_bytes(product->raw_product, *offset, string_length, name) < 0)
        {
            free(name);
            return -1;
        }
        *offset += string_length;
        /* chars padding */
        if ((string_length & 3) != 0)
        {
            *offset += 4 - (string_length & 3);
        }
        /* nelems */
        if (read_length_value(product, offset, &nelems) != 0)
        {
            free(name);
            return -1;
        }
        num_dims = 0;
        for (j = 0; j < nelems; j++)
        {
            /* dimid */
            if (read_length_value(product, offset, &dim_id) != 0)
            {
                free(name);
                return -1;
            }
            if (dim_id < 0 || dim_id >= num_dim_lengths)
            {
                coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid dimid for variable %s)", name);
                free(name);
                return -1;
            }
            if (j == nelems - 1)
            {
                last_dim_length = (long)dim_length[dim_id];
                last_dim_set = 1;
            }
            else
            {
                if (j < CODA_MAX_NUM_DIMS)
                {
                    dim[j] = (long)dim_length[dim_id];
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= (long)dim_length[dim_id];
                }
            }
            if (j == 0)
            {
                record_var = (dim_id == appendable_dim);
            }
        }

        conversion = coda_conversion_new(1.0, 1.0, 0.0, coda_NaN());
        if (conversion == NULL)
        {
            free(name);
            return -1;
        }
        /* vatt_array */
        if (read_att_array(product, offset, &attributes, conversion) != 0)
        {
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }

        /* nc_type */
        if (read_bytes(product->raw_product, *offset, 4, &nc_type) < 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&nc_type);
#endif
        *offset += 4;
        if (nc_type < 1 || nc_type > 6)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid netcdf type (%d))", (int)nc_type);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;

        }

        /* check if we need to use a conversion */
        if (conversion->numerator == 1.0 && conversion->add_offset == 0.0)
        {
            /* don't create conversions for non-floating type data if we only have an 'invalid_value' attribute */
            if ((nc_type != 5 && nc_type != 6) || coda_isNaN(conversion->invalid_value))
            {
                coda_conversion_delete(conversion);
                conversion = NULL;
            }
        }

        /* vsize */
        if (read_length_value(product, offset, &vsize) != 0)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (record_var)
        {
            product->record_size += (long)vsize;
        }

        /* offset */
        if (product->netcdf_version == 1)
        {
            int32_t offset32;

            if (read_bytes(product->raw_product, *offset, 4, &offset32) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&offset32);
#endif
            var_offset = (int64_t)offset32;
            *offset += 4;
        }
        else
        {
            if (read_bytes(product->raw_product, *offset, 8, &var_offset) < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int64(&var_offset);
#endif
            *offset += 8;
        }
        if (var_offset > product->file_size)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "invalid netCDF file (invalid offset for variable %s)", name);
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (last_dim_set)
        {
            if (nc_type == 2 && !(num_dims == 0 && record_var))
            {
                /* we treat the last dimension of a char array as a string */
                /* except if it is a one dimensional char array where the first dimension is the appendable dimension */
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, last_dim_length);
            }
            else
            {
                basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, record_var, 1);
                if (num_dims < CODA_MAX_NUM_DIMS)
                {
                    dim[num_dims] = last_dim_length;
                    num_dims++;
                }
                else
                {
                    dim[CODA_MAX_NUM_DIMS - 1] *= last_dim_length;
                }
            }
        }
        else
        {
            /* we only get here if the variable is a real scalar (num_dims == 0) */
            basic_type = coda_netcdf_basic_type_new(nc_type, var_offset, 0, 1);
        }
        if (basic_type == NULL)
        {
            coda_dynamic_type_delete((coda_dynamic_type *)attributes);
            coda_conversion_delete(conversion);
            free(name);
            return -1;
        }
        if (conversion != NULL)
        {
            if (coda_netcdf_basic_type_set_conversion(basic_type, conversion) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                coda_conversion_delete(conversion);
                free(name);
                return -1;
            }
        }
        if (num_dims == 0)
        {
            if (attributes != NULL)
            {
                if (coda_netcdf_basic_type_set_attributes(basic_type, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)basic_type, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                free(name);
                return -1;
            }
        }
        else
        {
            coda_netcdf_array *array;

            array = coda_netcdf_array_new(num_dims, dim, basic_type);
            if (array == NULL)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)basic_type);
                coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                free(name);
                return -1;
            }
            if (attributes != NULL)
            {
                if (coda_netcdf_array_set_attributes(array, attributes) != 0)
                {
                    coda_dynamic_type_delete((coda_dynamic_type *)array);
                    coda_dynamic_type_delete((coda_dynamic_type *)attributes);
                    free(name);
                    return -1;
                }
            }
            if (coda_mem_record_add_field(root, name, (coda_dynamic_type *)array, 1) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)array);
                free(name);
                return -1;
            }
        }
        free(name);
    }

    return 0;
}